

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  void *pvVar2;
  int iVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  JSAMPLE JVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  JSAMPLE *pJVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  undefined1 auVar32 [16];
  int aiStack_154 [7];
  int aiStack_138 [66];
  
  pJVar1 = cinfo->sample_range_limit;
  pvVar2 = compptr->dct_table;
  for (lVar15 = 0; (int)lVar15 != 8; lVar15 = lVar15 + 1) {
    sVar4 = coef_block[lVar15 + 0x10];
    if (sVar4 == 0 && coef_block[lVar15 + 8] == 0) {
      if (((coef_block[lVar15 + 0x18] != 0) || (coef_block[lVar15 + 0x20] != 0)) ||
         ((coef_block[lVar15 + 0x28] != 0 ||
          ((coef_block[lVar15 + 0x30] != 0 || (coef_block[lVar15 + 0x38] != 0)))))) {
        sVar4 = 0;
        goto LAB_001293f8;
      }
      iVar11 = (int)*(short *)((long)pvVar2 + lVar15 * 2) * (int)coef_block[lVar15] * 4;
      aiStack_154[lVar15 + 7] = iVar11;
      aiStack_154[lVar15 + 0xf] = iVar11;
      aiStack_154[lVar15 + 0x17] = iVar11;
      aiStack_154[lVar15 + 0x1f] = iVar11;
      aiStack_154[lVar15 + 0x27] = iVar11;
      aiStack_154[lVar15 + 0x2f] = iVar11;
      aiStack_154[lVar15 + 0x37] = iVar11;
      lVar18 = 0xe0;
    }
    else {
LAB_001293f8:
      lVar18 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x20) * (long)sVar4;
      lVar21 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x60) * (long)coef_block[lVar15 + 0x30];
      lVar8 = (lVar21 + lVar18) * 0x1151;
      lVar23 = lVar21 * -0x3b21 + lVar8;
      lVar8 = lVar18 * 0x187e + lVar8;
      lVar22 = (long)*(short *)((long)pvVar2 + lVar15 * 2) * (long)coef_block[lVar15];
      lVar19 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x40) * (long)coef_block[lVar15 + 0x20];
      lVar26 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x70) * (long)coef_block[lVar15 + 0x38];
      lVar28 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x50) * (long)coef_block[lVar15 + 0x28];
      lVar14 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x30) * (long)coef_block[lVar15 + 0x18];
      lVar20 = (long)*(short *)((long)pvVar2 + lVar15 * 2 + 0x10) * (long)coef_block[lVar15 + 8];
      lVar21 = (lVar20 + lVar28 + lVar26 + lVar14) * 0x25a1;
      lVar18 = (lVar26 + lVar14) * -0x3ec5 + lVar21;
      lVar21 = (lVar20 + lVar28) * -0xc7c + lVar21;
      lVar16 = (lVar14 + lVar28) * -0x5203;
      lVar17 = (lVar20 + lVar26) * -0x1ccd;
      lVar26 = lVar26 * 0x98e + lVar17 + lVar18;
      lVar18 = lVar14 * 0x6254 + lVar16 + lVar18;
      lVar30 = (lVar19 + lVar22) * 0x2000;
      lVar28 = lVar28 * 0x41b3 + lVar16 + lVar21;
      lVar21 = lVar20 * 0x300b + lVar17 + lVar21;
      lVar14 = lVar30 - lVar8;
      lVar8 = lVar30 + 0x400 + lVar8;
      aiStack_154[lVar15 + 7] = (int)((ulong)(lVar8 + lVar21) >> 0xb);
      lVar16 = (lVar22 - lVar19) * 0x2000;
      aiStack_154[lVar15 + 0x3f] = (int)((ulong)(lVar8 - lVar21) >> 0xb);
      lVar21 = lVar16 - lVar23;
      lVar23 = lVar16 + 0x400 + lVar23;
      aiStack_154[lVar15 + 0xf] = (int)((ulong)(lVar23 + lVar18) >> 0xb);
      aiStack_154[lVar15 + 0x37] = (int)((ulong)(lVar23 - lVar18) >> 0xb);
      aiStack_154[lVar15 + 0x17] = (int)(lVar21 + lVar28 + 0x400U >> 0xb);
      aiStack_154[lVar15 + 0x2f] = (int)((ulong)((lVar21 + 0x400) - lVar28) >> 0xb);
      aiStack_154[lVar15 + 0x1f] = (int)(lVar14 + lVar26 + 0x400U >> 0xb);
      iVar11 = (int)((ulong)((lVar14 + 0x400) - lVar26) >> 0xb);
      lVar18 = 0x80;
    }
    *(int *)((long)aiStack_154 + lVar15 * 4 + lVar18 + 0x1c) = iVar11;
  }
  lVar15 = 7;
  do {
    if (lVar15 == 0x47) {
      return;
    }
    pJVar24 = (JSAMPLE *)(*(long *)((long)output_buf + lVar15 + -7) + (ulong)output_col);
    iVar11 = aiStack_154[lVar15 + 1];
    iVar12 = aiStack_154[lVar15 + 2];
    if (aiStack_154[lVar15 + 2] == 0 && iVar11 == 0) {
      iVar25 = 0;
      iVar12 = 0;
      if ((((aiStack_154[lVar15 + 3] != 0) || (aiStack_154[lVar15 + 4] != 0)) ||
          (iVar12 = iVar25, aiStack_154[lVar15 + 5] != 0)) ||
         ((aiStack_154[lVar15 + 6] != 0 || (aiStack_154[lVar15 + 7] != 0)))) goto LAB_0012965a;
      JVar9 = pJVar1[(ulong)(aiStack_154[lVar15] + 0x10U >> 5 & 0x3ff) + 0x80];
      auVar32 = pshuflw(ZEXT216(CONCAT11(JVar9,JVar9)),ZEXT216(CONCAT11(JVar9,JVar9)),0);
      *(int *)pJVar24 = auVar32._0_4_;
      pJVar24[4] = JVar9;
      pJVar24[5] = JVar9;
      pJVar24[6] = JVar9;
      lVar18 = 7;
    }
    else {
LAB_0012965a:
      iVar10 = (aiStack_154[lVar15 + 6] + iVar12) * 0x1151;
      iVar13 = aiStack_154[lVar15 + 6] * -0x3b21 + iVar10;
      iVar10 = iVar12 * 0x187e + iVar10;
      iVar12 = aiStack_154[lVar15 + 3];
      iVar25 = aiStack_154[lVar15 + 7];
      iVar27 = aiStack_154[lVar15 + 5];
      iVar5 = (iVar12 + iVar25 + iVar11 + iVar27) * 0x25a1;
      iVar3 = (iVar12 + iVar25) * -0x3ec5 + iVar5;
      iVar5 = (iVar11 + iVar27) * -0xc7c + iVar5;
      iVar6 = (iVar12 + iVar27) * -0x5203;
      iVar7 = (iVar25 + iVar11) * -0x1ccd;
      iVar31 = iVar25 * 0x98e + iVar7 + iVar3;
      iVar3 = iVar12 * 0x6254 + iVar6 + iVar3;
      iVar29 = (aiStack_154[lVar15 + 4] + aiStack_154[lVar15]) * 0x2000;
      iVar12 = (aiStack_154[lVar15] - aiStack_154[lVar15 + 4]) * 0x2000;
      iVar27 = iVar27 * 0x41b3 + iVar6 + iVar5;
      iVar5 = iVar11 * 0x300b + iVar7 + iVar5;
      iVar25 = iVar29 - iVar10;
      iVar10 = iVar29 + 0x20000 + iVar10;
      iVar11 = iVar12 - iVar13;
      iVar13 = iVar12 + 0x20000 + iVar13;
      *pJVar24 = pJVar1[(ulong)((uint)(iVar10 + iVar5) >> 0x12 & 0x3ff) + 0x80];
      pJVar24[7] = pJVar1[(ulong)((uint)(iVar10 - iVar5) >> 0x12 & 0x3ff) + 0x80];
      pJVar24[1] = pJVar1[(ulong)((uint)(iVar13 + iVar3) >> 0x12 & 0x3ff) + 0x80];
      pJVar24[6] = pJVar1[(ulong)((uint)(iVar13 - iVar3) >> 0x12 & 0x3ff) + 0x80];
      pJVar24[2] = pJVar1[(ulong)(iVar11 + iVar27 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
      pJVar24[5] = pJVar1[(ulong)((uint)((iVar11 + 0x20000) - iVar27) >> 0x12 & 0x3ff) + 0x80];
      pJVar24[3] = pJVar1[(ulong)(iVar25 + iVar31 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
      JVar9 = pJVar1[(ulong)((uint)((iVar25 + 0x20000) - iVar31) >> 0x12 & 0x3ff) + 0x80];
      lVar18 = 4;
    }
    pJVar24[lVar18] = JVar9;
    lVar15 = lVar15 + 8;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_islow(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);

    tmp0 = LEFT_SHIFT(z2 + z3, CONST_BITS);
    tmp1 = LEFT_SHIFT(z2 - z3, CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE * 0] = (int)DESCALE(tmp10 + tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 7] = (int)DESCALE(tmp10 - tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 1] = (int)DESCALE(tmp11 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 6] = (int)DESCALE(tmp11 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 2] = (int)DESCALE(tmp12 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 5] = (int)DESCALE(tmp12 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 3] = (int)DESCALE(tmp13 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 4] = (int)DESCALE(tmp13 - tmp0, CONST_BITS - PASS1_BITS);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0] + (JLONG)wsptr[4], CONST_BITS);
    tmp1 = LEFT_SHIFT((JLONG)wsptr[0] - (JLONG)wsptr[4], CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (JLONG)wsptr[7];
    tmp1 = (JLONG)wsptr[5];
    tmp2 = (JLONG)wsptr[3];
    tmp3 = (JLONG)wsptr[1];

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)DESCALE(tmp10 - tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp11 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)DESCALE(tmp11 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 + tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)DESCALE(tmp12 - tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp13 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)DESCALE(tmp13 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}